

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_htmlReadDoc(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  char *val_00;
  char *val_01;
  htmlDocPtr val_02;
  int local_4c;
  int n_options;
  int options;
  int n_encoding;
  char *encoding;
  int n_url;
  char *url;
  int n_str;
  xmlChar *str;
  htmlDocPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (url._4_4_ = 0; (int)url._4_4_ < 5; url._4_4_ = url._4_4_ + 1) {
    for (encoding._4_4_ = 0; (int)encoding._4_4_ < 4; encoding._4_4_ = encoding._4_4_ + 1) {
      for (n_options = 0; n_options < 4; n_options = n_options + 1) {
        for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_const_xmlChar_ptr(url._4_4_,0);
          val_00 = gen_const_char_ptr(encoding._4_4_,1);
          val_01 = gen_const_char_ptr(n_options,2);
          iVar2 = gen_int(local_4c,3);
          val_02 = (htmlDocPtr)htmlReadDoc(val,val_00,val_01,iVar2);
          desret_htmlDocPtr(val_02);
          call_tests = call_tests + 1;
          des_const_xmlChar_ptr(url._4_4_,val,0);
          des_const_char_ptr(encoding._4_4_,val_00,1);
          des_const_char_ptr(n_options,val_01,2);
          des_int(local_4c,iVar2,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlReadDoc",(ulong)(uint)(iVar2 - iVar1));
            ret_val._4_4_ = ret_val._4_4_ + 1;
            printf(" %d",(ulong)url._4_4_);
            printf(" %d",(ulong)encoding._4_4_);
            printf(" %d",(ulong)(uint)n_options);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_htmlReadDoc(void) {
    int test_ret = 0;

#if defined(LIBXML_HTML_ENABLED)
    int mem_base;
    htmlDocPtr ret_val;
    const xmlChar * str; /* a pointer to a zero terminated string */
    int n_str;
    const char * url; /* only used for error reporting (optoinal) */
    int n_url;
    const char * encoding; /* the document encoding (optional) */
    int n_encoding;
    int options; /* a combination of htmlParserOptions */
    int n_options;

    for (n_str = 0;n_str < gen_nb_const_xmlChar_ptr;n_str++) {
    for (n_url = 0;n_url < gen_nb_const_char_ptr;n_url++) {
    for (n_encoding = 0;n_encoding < gen_nb_const_char_ptr;n_encoding++) {
    for (n_options = 0;n_options < gen_nb_int;n_options++) {
        mem_base = xmlMemBlocks();
        str = gen_const_xmlChar_ptr(n_str, 0);
        url = gen_const_char_ptr(n_url, 1);
        encoding = gen_const_char_ptr(n_encoding, 2);
        options = gen_int(n_options, 3);

        ret_val = htmlReadDoc(str, url, encoding, options);
        desret_htmlDocPtr(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_str, str, 0);
        des_const_char_ptr(n_url, url, 1);
        des_const_char_ptr(n_encoding, encoding, 2);
        des_int(n_options, options, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in htmlReadDoc",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_str);
            printf(" %d", n_url);
            printf(" %d", n_encoding);
            printf(" %d", n_options);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}